

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

Entry * __thiscall
kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::insert
          (HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo> *this,
          StringPtr key,FieldNameInfo *value)

{
  char *pcVar1;
  size_t sVar2;
  Entry *pEVar3;
  Entry local_40;
  
  local_40.key.content.size_ = key.content.size_;
  local_40.key.content.ptr = key.content.ptr;
  local_40.value.type = value->type;
  local_40.value.index = value->index;
  local_40.value.prefixLength = value->prefixLength;
  local_40.value.ownName.content.ptr = (value->ownName).content.ptr;
  local_40.value.ownName.content.size_ = (value->ownName).content.size_;
  local_40.value.ownName.content.disposer = (value->ownName).content.disposer;
  (value->ownName).content.ptr = (char *)0x0;
  (value->ownName).content.size_ = 0;
  pEVar3 = Table<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>_>
           ::insert(&this->table,&local_40);
  sVar2 = local_40.value.ownName.content.size_;
  pcVar1 = local_40.value.ownName.content.ptr;
  if (local_40.value.ownName.content.ptr != (char *)0x0) {
    local_40.value.ownName.content.ptr = (char *)0x0;
    local_40.value.ownName.content.size_ = 0;
    (**(local_40.value.ownName.content.disposer)->_vptr_ArrayDisposer)
              (local_40.value.ownName.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return pEVar3;
}

Assistant:

typename HashMap<Key, Value>::Entry& HashMap<Key, Value>::insert(Key key, Value value) {
  return table.insert(Entry { kj::mv(key), kj::mv(value) });
}